

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

string * __thiscall
VulkanHppGenerator::generateRAIIHandleSingularConstructorArguments
          (string *__return_storage_ptr__,VulkanHppGenerator *this,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>
          *handle,vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                  *params,string *argumentType,string *argumentName)

{
  TypeInfo *pTVar1;
  string *this_00;
  bool bVar2;
  __type_conflict _Var3;
  bool bVar4;
  pointer ppVar5;
  vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_> *pvVar6;
  pointer ppVar7;
  _Base_ptr value;
  pointer pMVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  allocator<char> local_2d1;
  string local_2d0;
  string local_2b0;
  string local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  undefined1 local_250 [8];
  string argument;
  __normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>
  local_228;
  const_iterator memberIt;
  _Self local_218;
  const_iterator structureIt;
  ParamData *param;
  const_iterator __end5;
  const_iterator __begin5;
  vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_> *__range5;
  undefined1 local_1e8 [7];
  bool found;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  reference local_160;
  reference local_150;
  reference local_148;
  ParamData *destructorParam;
  const_iterator __end2;
  const_iterator __begin2;
  vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_> *__range2;
  type *local_108;
  type *parentName;
  type *parentType;
  _Self local_b8 [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_39;
  string *local_38;
  string *argumentName_local;
  string *argumentType_local;
  vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
  *params_local;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>
  *handle_local;
  VulkanHppGenerator *this_local;
  string *arguments;
  
  local_39 = 0;
  local_38 = argumentName;
  argumentName_local = argumentType;
  argumentType_local = (string *)params;
  params_local = (vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                  *)handle;
  handle_local = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>
                  *)this;
  this_local = (VulkanHppGenerator *)__return_storage_ptr__;
  std::operator+(&local_a0,"*reinterpret_cast<",argumentType);
  std::operator+(&local_80,&local_a0," *>( &");
  std::operator+(&local_60,&local_80,local_38);
  std::operator+(__return_storage_ptr__,&local_60," )");
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  pvVar6 = params_local + 0x10;
  local_b8[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>_>
       ::end(&this->m_commands);
  bVar2 = std::operator==((_Self *)&(pvVar6->
                                    super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                    )._M_impl.super__Vector_impl_data._M_finish,local_b8);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    getParentTypeAndName
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&parentType,this,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>
                *)params_local);
    parentName = std::get<0ul,std::__cxx11::string,std::__cxx11::string>
                           ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&parentType);
    local_108 = std::get<1ul,std::__cxx11::string,std::__cxx11::string>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&parentType);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2,
                   "Vk",parentName);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (parentName,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2);
    std::__cxx11::string::~string((string *)&__range2);
    ppVar5 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>
                           *)&params_local[0x10].
                              super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                              ._M_impl.super__Vector_impl_data._M_finish);
    pvVar6 = &(ppVar5->second).params;
    __end2 = std::
             vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>::
             begin(pvVar6);
    destructorParam =
         (ParamData *)
         std::vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
         ::end(pvVar6);
    while (bVar2 = __gnu_cxx::
                   operator==<const_VulkanHppGenerator::ParamData_*,_std::vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>_>
                             (&__end2,(__normal_iterator<const_VulkanHppGenerator::ParamData_*,_std::vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>_>
                                       *)&destructorParam), ((bVar2 ^ 0xffU) & 1) != 0) {
      local_148 = __gnu_cxx::
                  __normal_iterator<const_VulkanHppGenerator::ParamData_*,_std::vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>_>
                  ::operator*(&__end2);
      _Var3 = std::operator==(&(local_148->type).type,parentName);
      if ((((_Var3 ^ 0xffU) & 1) != 0) &&
         (_Var3 = std::operator==(&(local_148->type).type,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)params_local), ((_Var3 ^ 0xffU) & 1) != 0)) {
        ppVar5 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>
                 ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>
                               *)&params_local[0x10].
                                  super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                  ._M_impl.super__Vector_impl_data._M_finish);
        local_150 = local_148;
        bVar2 = std::ranges::__none_of_fn::
                operator()<const_std::vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>_&,_std::identity,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_KhronosGroup[P]Vulkan_Hpp_VulkanHppGenerator_cpp:10427:34)>
                          ((__none_of_fn *)&std::ranges::none_of,&(ppVar5->second).params,local_148)
        ;
        if (bVar2) {
          local_160 = local_148;
          bVar2 = std::ranges::__any_of_fn::
                  operator()<const_std::vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>_&,_std::identity,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_KhronosGroup[P]Vulkan_Hpp_VulkanHppGenerator_cpp:10429:43)>
                            ((__any_of_fn *)&std::ranges::any_of,argumentType_local,local_148);
          this_00 = argumentType_local;
          if (bVar2) {
            bVar2 = isHandleType(this,&(local_148->type).type);
            if (bVar2) {
              bVar2 = TypeInfo::isValue(&local_148->type);
              if (!bVar2) {
                __assert_fail("destructorParam.type.isValue()",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                              ,0x28c1,
                              "std::string VulkanHppGenerator::generateRAIIHandleSingularConstructorArguments(const std::pair<std::string, HandleData> &, const std::vector<ParamData> &, const std::string &, const std::string &) const"
                             );
              }
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1e8,", static_cast<",&(local_148->type).type);
              std::operator+(&local_1c8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1e8,">( *");
              std::operator+(&local_1a8,&local_1c8,&local_148->name);
              std::operator+(&local_188,&local_1a8," )");
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator+=(__return_storage_ptr__,&local_188);
              std::__cxx11::string::~string((string *)&local_188);
              std::__cxx11::string::~string((string *)&local_1a8);
              std::__cxx11::string::~string((string *)&local_1c8);
              std::__cxx11::string::~string((string *)local_1e8);
            }
            else {
              bVar2 = std::operator==(&(local_148->type).type,"VkAllocationCallbacks");
              if (!bVar2) {
                __assert_fail("destructorParam.type.type == \"VkAllocationCallbacks\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                              ,0x28c6,
                              "std::string VulkanHppGenerator::generateRAIIHandleSingularConstructorArguments(const std::pair<std::string, HandleData> &, const std::vector<ParamData> &, const std::string &, const std::string &) const"
                             );
              }
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator+=(__return_storage_ptr__,", allocator");
            }
          }
          else {
            bVar2 = false;
            __end5 = std::
                     vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                     ::begin((vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                              *)argumentType_local);
            param = (ParamData *)
                    std::
                    vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                    ::end((vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                           *)this_00);
            while (bVar4 = __gnu_cxx::
                           operator==<const_VulkanHppGenerator::ParamData_*,_std::vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>_>
                                     (&__end5,(__normal_iterator<const_VulkanHppGenerator::ParamData_*,_std::vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>_>
                                               *)&param), ((bVar4 ^ 0xffU) & 1) != 0) {
              structureIt._M_node =
                   (_Base_ptr)
                   __gnu_cxx::
                   __normal_iterator<const_VulkanHppGenerator::ParamData_*,_std::vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>_>
                   ::operator*(&__end5);
              local_218._M_node =
                   (_Base_ptr)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>_>
                   ::find(&this->m_structs,&(((reference)structureIt._M_node)->type).type);
              memberIt._M_current =
                   (MemberData *)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>_>
                   ::end(&this->m_structs);
              bVar4 = std::operator==(&local_218,(_Self *)&memberIt);
              if (((bVar4 ^ 0xffU) & 1) != 0) {
                pTVar1 = &local_148->type;
                ppVar7 = std::
                         _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>
                         ::operator->(&local_218);
                local_228._M_current =
                     (MemberData *)
                     findStructMemberItByType(this,&pTVar1->type,&(ppVar7->second).members);
                ppVar7 = std::
                         _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>
                         ::operator->(&local_218);
                argument.field_2._8_8_ =
                     std::
                     vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
                     ::end(&(ppVar7->second).members);
                bVar4 = __gnu_cxx::
                        operator==<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>
                                  (&local_228,
                                   (__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>
                                    *)((long)&argument.field_2 + 8));
                if (((bVar4 ^ 0xffU) & 1) != 0) {
                  bVar2 = true;
                  bVar4 = TypeInfo::isValue((TypeInfo *)structureIt._M_node);
                  if (((bVar4 ^ 0xffU) & 1) == 0) {
                    __assert_fail("!param.type.isValue()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                                  ,0x28da,
                                  "std::string VulkanHppGenerator::generateRAIIHandleSingularConstructorArguments(const std::pair<std::string, HandleData> &, const std::vector<ParamData> &, const std::string &, const std::string &) const"
                                 );
                  }
                  value = structureIt._M_node + 3;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_2d0,"p",&local_2d1);
                  stripPrefix(&local_2b0,(string *)value,&local_2d0);
                  anon_unknown.dwarf_b1723::startLowerCase(&local_290,&local_2b0);
                  std::operator+(&local_270,&local_290,".");
                  pMVar8 = __gnu_cxx::
                           __normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>
                           ::operator->(&local_228);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_250,&local_270,&pMVar8->name);
                  std::__cxx11::string::~string((string *)&local_270);
                  std::__cxx11::string::~string((string *)&local_290);
                  std::__cxx11::string::~string((string *)&local_2b0);
                  std::__cxx11::string::~string((string *)&local_2d0);
                  std::allocator<char>::~allocator(&local_2d1);
                  pMVar8 = __gnu_cxx::
                           __normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>
                           ::operator->(&local_228);
                  bVar4 = isHandleType(this,&(pMVar8->type).type);
                  if (bVar4) {
                    pMVar8 = __gnu_cxx::
                             __normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>
                             ::operator->(&local_228);
                    std::operator+(&local_358,"static_cast<",&(pMVar8->type).type);
                    std::operator+(&local_338,&local_358,">( ");
                    std::operator+(&local_318,&local_338,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_250);
                    std::operator+(&local_2f8,&local_318," )");
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_250,&local_2f8);
                    std::__cxx11::string::~string((string *)&local_2f8);
                    std::__cxx11::string::~string((string *)&local_318);
                    std::__cxx11::string::~string((string *)&local_338);
                    std::__cxx11::string::~string((string *)&local_358);
                  }
                  std::operator+(&local_378,", ",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_250);
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  operator+=(__return_storage_ptr__,&local_378);
                  std::__cxx11::string::~string((string *)&local_378);
                  std::__cxx11::string::~string((string *)local_250);
                  break;
                }
              }
              __gnu_cxx::
              __normal_iterator<const_VulkanHppGenerator::ParamData_*,_std::vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>_>
              ::operator++(&__end5);
            }
            if (!bVar2) {
              __assert_fail("found",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                            ,0x28e5,
                            "std::string VulkanHppGenerator::generateRAIIHandleSingularConstructorArguments(const std::pair<std::string, HandleData> &, const std::vector<ParamData> &, const std::string &, const std::string &) const"
                           );
            }
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<const_VulkanHppGenerator::ParamData_*,_std::vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>_>
      ::operator++(&__end2);
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&parentType);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateRAIIHandleSingularConstructorArguments( std::pair<std::string, HandleData> const & handle,
                                                                                std::vector<ParamData> const &             params,
                                                                                std::string const &                        argumentType,
                                                                                std::string const &                        argumentName ) const
{
  std::string arguments = "*reinterpret_cast<" + argumentType + " *>( &" + argumentName + " )";
  if ( handle.second.destructorIt != m_commands.end() )
  {
    auto [parentType, parentName] = getParentTypeAndName( handle );
    parentType                    = "Vk" + parentType;
    for ( auto const & destructorParam : handle.second.destructorIt->second.params )
    {
      if ( ( destructorParam.type.type != parentType ) && ( destructorParam.type.type != handle.first ) &&
           std::ranges::none_of( handle.second.destructorIt->second.params,
                                 [&destructorParam]( ParamData const & pd ) { return pd.lenExpression == destructorParam.name; } ) )
      {
        if ( std::ranges::any_of( params, [&destructorParam]( ParamData const & pd ) { return pd.type.type == destructorParam.type.type; } ) )
        {
          if ( isHandleType( destructorParam.type.type ) )
          {
            assert( destructorParam.type.isValue() );
            arguments += ", static_cast<" + destructorParam.type.type + ">( *" + destructorParam.name + " )";
          }
          else
          {
            assert( destructorParam.type.type == "VkAllocationCallbacks" );
            arguments += ", allocator";
          }
        }
        else
        {
#if !defined( NDEBUG )
          bool found = false;
#endif
          for ( auto const & param : params )
          {
            auto structureIt = m_structs.find( param.type.type );
            if ( structureIt != m_structs.end() )
            {
              auto memberIt = findStructMemberItByType( destructorParam.type.type, structureIt->second.members );
              if ( memberIt != structureIt->second.members.end() )
              {
#if !defined( NDEBUG )
                found = true;
#endif
                assert( !param.type.isValue() );
                std::string argument = startLowerCase( stripPrefix( param.name, "p" ) ) + "." + memberIt->name;
                if ( isHandleType( memberIt->type.type ) )
                {
                  argument = "static_cast<" + memberIt->type.type + ">( " + argument + " )";
                }
                arguments += ", " + argument;
                break;
              }
            }
          }
          assert( found );
        }
      }
    }
  }
  return arguments;
}